

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

double __thiscall icu_63::CalendarAstronomer::getSiderealOffset(CalendarAstronomer *this)

{
  UBool UVar1;
  double dVar2;
  
  UVar1 = uprv_isNaN_63(this->siderealT0);
  if (UVar1 == '\0') {
    dVar2 = this->siderealT0;
  }
  else {
    dVar2 = getJulianDay(this);
    dVar2 = uprv_floor_63(dVar2 + -0.5);
    dVar2 = (dVar2 + 0.5 + -2451545.0) / 36525.0;
    dVar2 = normalize(dVar2 * dVar2 * 2.5862e-05 + dVar2 * 2400.051336 + 6.697374558,24.0);
    this->siderealT0 = dVar2;
  }
  return dVar2;
}

Assistant:

double CalendarAstronomer::getSiderealOffset() {
    if (isINVALID(siderealT0)) {
        double JD  = uprv_floor(getJulianDay() - 0.5) + 0.5;
        double S   = JD - 2451545.0;
        double T   = S / 36525.0;
        siderealT0 = normalize(6.697374558 + 2400.051336*T + 0.000025862*T*T, 24);
    }
    return siderealT0;
}